

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O2

void __thiscall Minisat::OnlineProofChecker::printState(OnlineProofChecker *this)

{
  ulong *puVar1;
  uint uVar2;
  uint *puVar3;
  ostream *poVar4;
  ulong uVar5;
  int j;
  ulong uVar6;
  int i_1;
  long lVar7;
  int i;
  long lVar8;
  Lit local_3c;
  OnlineProofChecker *local_38;
  
  if (1 < this->verbose) {
    fullCheck(this);
    poVar4 = std::operator<<((ostream *)&std::cerr,"c [DRAT-OTFC] STATE:");
    std::endl<char,std::char_traits<char>>(poVar4);
    lVar7 = 0;
    for (lVar8 = 0; lVar8 < (this->unitClauses).sz; lVar8 = lVar8 + 1) {
      poVar4 = operator<<((ostream *)&std::cerr,
                          (Lit *)((long)&((this->unitClauses).data)->x + lVar7));
      poVar4 = std::operator<<(poVar4," 0");
      std::endl<char,std::char_traits<char>>(poVar4);
      lVar7 = lVar7 + 4;
    }
    local_38 = this;
    for (lVar7 = 0; lVar7 < (this->clauses).sz; lVar7 = lVar7 + 1) {
      puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
      uVar2 = (this->clauses).data[lVar7];
      uVar5 = *(ulong *)(puVar3 + uVar2);
      if ((uVar5 & 3) == 0) {
        puVar1 = (ulong *)(puVar3 + uVar2);
        for (uVar6 = 0; uVar6 < uVar5 >> 0x22; uVar6 = uVar6 + 1) {
          local_3c.x = *(int *)((long)puVar1 + uVar6 * 4 + 8);
          poVar4 = operator<<((ostream *)&std::cerr,&local_3c);
          std::operator<<(poVar4," ");
          uVar5 = *puVar1;
        }
        poVar4 = std::operator<<((ostream *)&std::cerr,"0");
        std::endl<char,std::char_traits<char>>(poVar4);
        this = local_38;
      }
    }
  }
  return;
}

Assistant:

inline void OnlineProofChecker::printState()
{
    if (verbose < 2) {
        return;
    }

    fullCheck();

    std::cerr << "c [DRAT-OTFC] STATE:" << std::endl;
    for (int i = 0; i < unitClauses.size(); ++i) {
        std::cerr << unitClauses[i] << " 0" << std::endl;
    }
    for (int i = 0; i < clauses.size(); ++i) {
        const Clause &clause = ca[clauses[i]];
        if (clause.mark() != 0) {
            continue;
        } // jump over this clause
        for (int j = 0; j < clause.size(); ++j) {
            std::cerr << clause[j] << " ";
        }
        std::cerr << "0" << std::endl;
    }
}